

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_uint8_srgb_AR(float *decodep,int width_times_channels,void *inputp)

{
  byte *local_38;
  uchar *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  
  local_38 = (byte *)inputp;
  for (decode_end = decodep + 4; decode_end <= decodep + width_times_channels;
      decode_end = decode_end + 4) {
    decode_end[-4] = stbir__srgb_uchar_to_linear_float[local_38[1]];
    decode_end[-3] = stbir__srgb_uchar_to_linear_float[*local_38];
    decode_end[-2] = stbir__srgb_uchar_to_linear_float[local_38[3]];
    decode_end[-1] = stbir__srgb_uchar_to_linear_float[local_38[2]];
    local_38 = local_38 + 4;
  }
  for (decode_end = decode_end + -4; decode_end < decodep + width_times_channels;
      decode_end = decode_end + 2) {
    *decode_end = stbir__srgb_uchar_to_linear_float[local_38[1]];
    decode_end[1] = stbir__srgb_uchar_to_linear_float[*local_38];
    local_38 = local_38 + 2;
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint8_srgb)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float const * decode_end = (float*) decode + width_times_channels;
  unsigned char const * input = (unsigned char const *)inputp;

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  while( decode <= decode_end )
  {
    decode[0-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    decode[1-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    decode[2-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    decode[3-4] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order3 ] ];
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order0 ] ];
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order1 ] ];
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__srgb_uchar_to_linear_float[ input[ stbir__decode_order2 ] ];
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}